

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O1

ON_PolynomialCurve * __thiscall
ON_PolynomialCurve::operator=(ON_PolynomialCurve *this,ON_BezierCurve *src)

{
  uint uVar1;
  int iVar2;
  ON_4dPoint *pOVar3;
  ON_4dPoint *pOVar4;
  bool bVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  ON_BezierCurve s;
  
  this->m_dim = src->m_dim;
  this->m_is_rat = src->m_is_rat;
  uVar1 = src->m_order;
  this->m_order = uVar1;
  if ((uint)(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity < uVar1) {
    ON_SimpleArray<ON_4dPoint>::SetCapacity
              (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,(long)(int)uVar1);
  }
  iVar2 = src->m_order;
  uVar1 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity;
  if (iVar2 <= (int)uVar1 && -1 < iVar2) {
    (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_count = iVar2;
  }
  pOVar3 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
  if (0 < (int)uVar1 && pOVar3 != (ON_4dPoint *)0x0) {
    memset(pOVar3,0,(ulong)uVar1 << 5);
  }
  if ((1 < this->m_order) && ((int)((uint)(src->m_is_rat != 0 && 0 < src->m_dim) + src->m_dim) < 5))
  {
    ON_BezierCurve::ON_BezierCurve(&s);
    s.m_dim = (src->m_dim + 1) - (uint)(src->m_is_rat == 0);
    s.m_is_rat = 0;
    s.m_order = src->m_order;
    s.m_cv = src->m_cv;
    bVar5 = ON_EvaluateBezier(s.m_dim,false,s.m_order,s.m_cv_stride,s.m_cv,0.0,1.0,
                              this->m_order + -1,0.0,4,
                              &((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->x);
    if (bVar5) {
      if (this->m_is_rat == 0) {
        ((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->w = 1.0;
      }
      else if ((this->m_dim < 3) && (0 < this->m_order)) {
        lVar8 = 0;
        lVar7 = 0;
        do {
          pOVar4 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
          pOVar3 = (ON_4dPoint *)((long)&pOVar4->x + lVar8);
          pdVar6 = ON_4dPoint::operator[](pOVar3,this->m_dim);
          *(double *)((long)&pOVar4->w + lVar8) = *pdVar6;
          pdVar6 = ON_4dPoint::operator[](pOVar3,this->m_dim);
          *pdVar6 = 0.0;
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0x20;
        } while (lVar7 < this->m_order);
      }
      iVar2 = this->m_order;
      if (2 < (long)iVar2) {
        pdVar6 = &(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a[2].w;
        lVar7 = 2;
        do {
          dVar9 = 1.0 / (double)(int)lVar7;
          ((ON_4dPoint *)(pdVar6 + -3))->x = ((ON_4dPoint *)(pdVar6 + -3))->x * dVar9;
          pdVar6[-2] = pdVar6[-2] * dVar9;
          pdVar6[-1] = pdVar6[-1] * dVar9;
          *pdVar6 = dVar9 * *pdVar6;
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6 + 4;
        } while (iVar2 != lVar7);
      }
    }
    else {
      pOVar3 = (this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a;
      if ((pOVar3 != (ON_4dPoint *)0x0) &&
         (lVar7 = (long)(this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_capacity, 0 < lVar7)) {
        memset(pOVar3,0,lVar7 << 5);
      }
      ((this->m_cv).super_ON_SimpleArray<ON_4dPoint>.m_a)->w = 1.0;
    }
    s.m_cv = (double *)0x0;
    ON_BezierCurve::~ON_BezierCurve(&s);
  }
  return this;
}

Assistant:

ON_PolynomialCurve& ON_PolynomialCurve::operator=(const ON_BezierCurve& src)
{
  int i;
  double d;
  m_dim = src.m_dim;
  m_is_rat = src.m_is_rat;
  m_order = src.m_order;
  m_cv.Reserve( src.m_order );
  m_cv.SetCount( src.m_order );
  m_cv.Zero();
  //m_domain = src.m_domain;

  if ( m_order >= 2 && src.CVSize() <= 4 ) {
    ON_BezierCurve s; // scratch surface for homogeneous evaluation
    s.m_dim = src.m_is_rat ? src.m_dim+1 : src.m_dim;
    s.m_is_rat = 0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;
    //s.m_domain.m_t[0] = 0.0;
    //s.m_domain.m_t[1] = 1.0;
    if ( s.Evaluate( 0.0, m_order-1, 4, &m_cv[0].x ) ) {
      if ( m_is_rat ) {
        if ( m_dim < 3 ) {
          for ( i = 0; i < m_order; i++ ) {
            ON_4dPoint& cv = m_cv[i];
            cv.w = cv[m_dim];
            cv[m_dim] = 0.0;
          }
        }
      }
      else {
        m_cv[0].w = 1.0;
      }
      for ( i = 2; i < m_order; i++ ) {
        d = 1.0/i;
        ON_4dPoint& cv = m_cv[i];
        cv.x *= d;
        cv.y *= d;
        cv.z *= d;
        cv.w *= d;
      }
    }
    else {
      m_cv.Zero();
      m_cv[0].w = 1.0;
    }
    s.m_cv = 0;
  }

  return *this;
}